

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O2

Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>
kj::rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>(void)

{
  Refcounted *refcounted;
  _func_int **pp_Var1;
  ThirdPartyExchangeValue *extraout_RDX;
  Disposer *in_RDI;
  Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> RVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x70);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[0xd] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR_disposeImpl_00665de0;
  *(undefined4 *)(pp_Var1 + 1) = 1;
  in_RDI->_vptr_Disposer = pp_Var1;
  in_RDI[1]._vptr_Disposer = pp_Var1;
  RVar2.own.ptr = extraout_RDX;
  RVar2.own.disposer = in_RDI;
  return (Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>)RVar2.own;
}

Assistant:

inline Rc<T> rc(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.
  // Returns smart pointer that can be used to manage references.

  return Refcounted::addRcRefInternal(new T(kj::fwd<Params>(params)...));
}